

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet_ntop.c
# Opt level: O0

char * Curl_inet_ntop(int af,void *src,char *buf,size_t size)

{
  int *piVar1;
  size_t size_local;
  char *buf_local;
  void *src_local;
  char *pcStack_10;
  int af_local;
  
  if (af == 2) {
    pcStack_10 = inet_ntop4((uchar *)src,buf,size);
  }
  else if (af == 10) {
    pcStack_10 = inet_ntop6((uchar *)src,buf,size);
  }
  else {
    piVar1 = __errno_location();
    *piVar1 = 0x61;
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

char *Curl_inet_ntop(int af, const void *src, char *buf, size_t size)
{
  switch(af) {
  case AF_INET:
    return inet_ntop4((const unsigned char *)src, buf, size);
#ifdef ENABLE_IPV6
  case AF_INET6:
    return inet_ntop6((const unsigned char *)src, buf, size);
#endif
  default:
    errno = EAFNOSUPPORT;
    return NULL;
  }
}